

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<AmbiguousInClass>::copyAppend
          (QGenericArrayOps<AmbiguousInClass> *this,AmbiguousInClass *b,AmbiguousInClass *e)

{
  AmbiguousInClass *this_00;
  ulong in_RDX;
  ulong in_RSI;
  AmbiguousInClass *in_RDI;
  AmbiguousInClass *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<AmbiguousInClass>::begin
                        ((QArrayDataPointer<AmbiguousInClass> *)0x16e723);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      CustomWidgetsInfo::isAmbiguous::AmbiguousInClass::AmbiguousInClass(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      (in_RDI->methodMap).d =
           (Data *)((long)&(((in_RDI->methodMap).d)->ref).atomic._q_value.super___atomic_base<int>.
                           _M_i + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }